

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_dump_(char *title,void *addr,size_t size)

{
  byte bVar1;
  size_t sVar2;
  ushort **ppuVar3;
  ulong in_RDX;
  long in_RSI;
  char *in_RDI;
  char *__format;
  uchar byte;
  size_t off;
  size_t line_end;
  size_t truncate;
  size_t line_beg;
  uint local_4c;
  ulong local_38;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  
  local_28 = 0;
  if (((1 < acutest_verbose_level_) && (acutest_current_test_ != (acutest_test_ *)0x0)) &&
     (acutest_cond_failed_ != 0)) {
    local_18 = in_RDX;
    if (0x400 < in_RDX) {
      local_28 = in_RDX - 0x400;
      local_18 = 0x400;
    }
    acutest_line_indent_(0);
    sVar2 = strlen(in_RDI);
    __format = "%s:\n";
    if (in_RDI[sVar2 - 1] == ':') {
      __format = "%s\n";
    }
    printf(__format,in_RDI);
    for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 0x10) {
      acutest_line_indent_(0);
      printf("%08lx: ",local_20);
      for (local_38 = local_20; local_38 < local_20 + 0x10; local_38 = local_38 + 1) {
        if (local_38 < local_18) {
          printf(" %02x",(ulong)*(byte *)(in_RSI + local_38));
        }
        else {
          printf("   ");
        }
      }
      printf("  ");
      for (local_38 = local_20;
          (local_38 < local_20 + 0x10 && (bVar1 = *(byte *)(in_RSI + local_38), local_38 < local_18)
          ); local_38 = local_38 + 1) {
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)(uint)bVar1] & 2) == 0) {
          local_4c = (uint)bVar1;
        }
        else {
          local_4c = 0x2e;
        }
        printf("%c",(ulong)local_4c);
      }
      printf("\n");
    }
    if (local_28 != 0) {
      acutest_line_indent_(0);
      printf("           ... (and more %u bytes)\n",local_28 & 0xffffffff);
    }
  }
  return;
}

Assistant:

void
acutest_dump_(const char* title, const void* addr, size_t size)
{
    static const size_t BYTES_PER_LINE = 16;
    size_t line_beg;
    size_t truncate = 0;

    if(acutest_verbose_level_ < 2)
        return;

    /* We allow extra message only when something is already wrong in the
     * current test. */
    if(acutest_current_test_ == NULL  ||  !acutest_cond_failed_)
        return;

    if(size > TEST_DUMP_MAXSIZE) {
        truncate = size - TEST_DUMP_MAXSIZE;
        size = TEST_DUMP_MAXSIZE;
    }

    acutest_line_indent_(acutest_case_name_[0] ? 3 : 2);
    printf((title[strlen(title)-1] == ':') ? "%s\n" : "%s:\n", title);

    for(line_beg = 0; line_beg < size; line_beg += BYTES_PER_LINE) {
        size_t line_end = line_beg + BYTES_PER_LINE;
        size_t off;

        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("%08lx: ", (unsigned long)line_beg);
        for(off = line_beg; off < line_end; off++) {
            if(off < size)
                printf(" %02x", ((const unsigned char*)addr)[off]);
            else
                printf("   ");
        }

        printf("  ");
        for(off = line_beg; off < line_end; off++) {
            unsigned char byte = ((const unsigned char*)addr)[off];
            if(off < size)
                printf("%c", (iscntrl(byte) ? '.' : byte));
            else
                break;
        }

        printf("\n");
    }

    if(truncate > 0) {
        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("           ... (and more %u bytes)\n", (unsigned) truncate);
    }
}